

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cancellation_signal.hpp
# Opt level: O0

op_cancellation * __thiscall
asio::cancellation_slot::
emplace<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>::op_cancellation,asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>*,asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>::per_timer_data*>
          (cancellation_slot *this,
          deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          **args,per_timer_data **args_1)

{
  op_cancellation *poVar1;
  undefined8 *in_RDI;
  pair<void_*,_unsigned_long> pVar2;
  cancellation_handler_type *handler_obj;
  auto_delete_helper del;
  auto_delete_helper *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  cancellation_handler<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::op_cancellation>
  *in_stack_ffffffffffffffd0;
  undefined8 local_28;
  
  pVar2 = prepare_memory((cancellation_slot *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                         (size_t)in_stack_ffffffffffffffc0);
  local_28 = (cancellation_handler<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::op_cancellation>
              *)pVar2.first;
  asio::detail::
  cancellation_handler<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>::op_cancellation>
  ::
  cancellation_handler<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>*,asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>::per_timer_data*>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
              **)in_stack_ffffffffffffffc0,(per_timer_data **)local_28);
  *(cancellation_handler<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::op_cancellation>
    **)*in_RDI = local_28;
  poVar1 = asio::detail::
           cancellation_handler<asio::detail::deadline_timer_service<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::op_cancellation>
           ::handler(local_28);
  auto_delete_helper::~auto_delete_helper(in_stack_ffffffffffffffc0);
  return poVar1;
}

Assistant:

CancellationHandler& emplace(Args&&... args)
  {
    typedef detail::cancellation_handler<CancellationHandler>
      cancellation_handler_type;
    auto_delete_helper del = { prepare_memory(
        sizeof(cancellation_handler_type),
        alignof(CancellationHandler)) };
    cancellation_handler_type* handler_obj =
      new (del.mem.first) cancellation_handler_type(
        del.mem.second, static_cast<Args&&>(args)...);
    del.mem.first = 0;
    *handler_ = handler_obj;
    return handler_obj->handler();
  }